

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufiber.hpp
# Opt level: O0

return_type
boost::asio::async_result<ufiber::yield_token<boost::asio::executor>,void()>::
initiate<boost::asio::detail::initiate_post,ufiber::yield_token<boost::asio::executor>&>
          (initiate_post *op,yield_token<boost::asio::executor> *token)

{
  promise<> *this;
  anon_class_16_2_08e66f54 local_50;
  undefined1 local_40 [8];
  completion_handler_type handler;
  fiber_context *ctx;
  yield_token<boost::asio::executor> *pyStack_18;
  promise<> promise;
  yield_token<boost::asio::executor> *token_local;
  initiate_post *op_local;
  
  this = (promise<> *)((long)&ctx + 4);
  pyStack_18 = token;
  ufiber::detail::promise<>::promise(this);
  handler.executor_.impl_ =
       (impl_base *)ufiber::detail::get_fiber<boost::asio::executor>(pyStack_18);
  ufiber::detail::completion_handler<boost::asio::executor>::completion_handler
            ((completion_handler<boost::asio::executor> *)local_40,this,pyStack_18,
             (fiber_context *)handler.executor_.impl_);
  local_50.op = op;
  local_50.handler = (completion_handler<boost::asio::executor> *)local_40;
  ufiber::detail::fiber_context::
  suspend_with<boost::asio::async_result<ufiber::yield_token<boost::asio::executor>,void()>::initiate<boost::asio::detail::initiate_post,ufiber::yield_token<boost::asio::executor>&>(boost::asio::detail::initiate_post&&,ufiber::yield_token<boost::asio::executor>&)::_lambda()_1_>
            ((fiber_context *)handler.executor_.impl_,&local_50);
  ufiber::detail::promise<>::get_value(this);
  ufiber::detail::completion_handler<boost::asio::executor>::~completion_handler
            ((completion_handler<boost::asio::executor> *)local_40);
  return;
}

Assistant:

static return_type initiate(Op&& op, Token&& token, Ts&&... ts)
    {
        ::ufiber::detail::promise<Args...> promise;
        ::ufiber::detail::fiber_context& ctx =
          ::ufiber::detail::get_fiber(token);
        completion_handler_type handler{&promise, token, ctx};
        ctx.suspend_with([&]() noexcept {
            op(std::move(handler), std::forward<Ts>(ts)...);
        });
        return promise.get_value();
    }